

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_bool nk_popup_begin(nk_context *ctx,nk_popup_type type,char *title,nk_flags flags,nk_rect rect)

{
  byte *pbVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  nk_window *pnVar4;
  nk_size nVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  nk_handle nVar8;
  nk_size nVar9;
  nk_size nVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  int iVar16;
  undefined4 uVar17;
  nk_hash nVar18;
  nk_bool nVar19;
  nk_page_element *__s;
  nk_panel *pnVar20;
  long lVar21;
  nk_page_element *__s_00;
  ulong uVar22;
  ulong uVar23;
  nk_rect r;
  float local_58;
  float fStack_54;
  
  nVar19 = 0;
  if (((ctx != (nk_context *)0x0) && (pnVar4 = ctx->current, nVar19 = 0, pnVar4 != (nk_window *)0x0)
      ) && (pnVar4->layout != (nk_panel *)0x0)) {
    lVar21 = 0;
    if ((title != (char *)0x0) && (*title != '\0')) {
      lVar21 = 0;
      do {
        lVar11 = lVar21 + 1;
        lVar21 = lVar21 + 1;
      } while (title[lVar11] != '\0');
    }
    nVar18 = nk_murmur_hash(title,(int)lVar21,4);
    __s = (nk_page_element *)(pnVar4->popup).win;
    if (__s == (nk_page_element *)0x0) {
      __s = nk_create_page_element(ctx);
      if (__s == (nk_page_element *)0x0) {
        __s = (nk_page_element *)0x0;
      }
      else {
        (__s->data).tbl.seq = ctx->seq;
      }
      (__s->data).win.parent = pnVar4;
      (pnVar4->popup).win = (nk_window *)__s;
      (pnVar4->popup).active = 0;
      (pnVar4->popup).type = NK_PANEL_POPUP;
    }
    local_58 = rect.x;
    fStack_54 = rect.y;
    if ((pnVar4->popup).name != nVar18) {
      if ((pnVar4->popup).active != 0) {
        return 0;
      }
      uVar22 = (ulong)__s & 3;
      if (uVar22 == 0) {
        uVar23 = 0x1d8;
        __s_00 = __s;
      }
      else {
        memset(__s,0,4 - uVar22);
        uVar23 = uVar22 | 0x1d4;
        __s_00 = (nk_page_element *)((4 - uVar22) + (long)__s);
      }
      uVar22 = (ulong)((uint)uVar23 & 0xfffffffc);
      memset(__s_00,0,uVar22);
      if ((uVar23 & 3) != 0) {
        memset((void *)((long)&__s_00->data + uVar22),0,uVar23 & 3);
      }
      (pnVar4->popup).name = nVar18;
      (pnVar4->popup).active = 1;
      (pnVar4->popup).type = NK_PANEL_POPUP;
    }
    ctx->current = (nk_window *)__s;
    uVar2 = (pnVar4->layout->clip).x;
    uVar3 = (pnVar4->layout->clip).y;
    (__s->data).win.parent = pnVar4;
    *(ulong *)((long)&__s->data + 0x4c) = CONCAT44((float)uVar3 + fStack_54,(float)uVar2 + local_58)
    ;
    *(long *)((long)&__s->data + 0x54) = rect._8_8_;
    (__s->data).tbl.seq = ctx->seq;
    pnVar20 = (nk_panel *)nk_create_panel(ctx);
    (__s->data).win.layout = pnVar20;
    (__s->data).tbl.keys[0x10] = (uint)(type == NK_POPUP_DYNAMIC) << 0xb | flags | 1;
    fVar12 = (pnVar4->buffer).clip.x;
    fVar13 = (pnVar4->buffer).clip.y;
    fVar14 = (pnVar4->buffer).clip.w;
    fVar15 = (pnVar4->buffer).clip.h;
    iVar16 = (pnVar4->buffer).use_clipping;
    uVar17 = *(undefined4 *)&(pnVar4->buffer).field_0x1c;
    nVar8 = (pnVar4->buffer).userdata;
    nVar5 = (pnVar4->buffer).begin;
    nVar9 = (pnVar4->buffer).end;
    nVar10 = (pnVar4->buffer).last;
    (__s->data).win.buffer.base = (pnVar4->buffer).base;
    *(float *)((long)&__s->data + 0x70) = fVar12;
    *(float *)((long)&__s->data + 0x74) = fVar13;
    *(float *)((long)&__s->data + 0x78) = fVar14;
    *(float *)((long)&__s->data + 0x7c) = fVar15;
    *(int *)((long)&__s->data + 0x80) = iVar16;
    *(undefined4 *)((long)&__s->data + 0x84) = uVar17;
    (__s->data).win.buffer.userdata = nVar8;
    (__s->data).win.buffer.begin = nVar5;
    (__s->data).win.buffer.end = nVar9;
    (__s->data).win.buffer.last = nVar10;
    uVar17 = (undefined4)(pnVar4->buffer).end;
    uVar6 = *(undefined4 *)((long)&(pnVar4->buffer).end + 4);
    nVar5 = (pnVar4->buffer).last;
    uVar7 = *(undefined4 *)((long)&(pnVar4->buffer).last + 4);
    *(undefined4 *)&(pnVar4->popup).buf.begin = uVar17;
    *(undefined4 *)((long)&(pnVar4->popup).buf.begin + 4) = uVar6;
    *(int *)&(pnVar4->popup).buf.parent = (int)nVar5;
    *(undefined4 *)((long)&(pnVar4->popup).buf.parent + 4) = uVar7;
    *(undefined4 *)&(pnVar4->popup).buf.last = uVar17;
    *(undefined4 *)((long)&(pnVar4->popup).buf.last + 4) = uVar6;
    *(undefined4 *)&(pnVar4->popup).buf.end = uVar17;
    *(undefined4 *)((long)&(pnVar4->popup).buf.end + 4) = uVar6;
    (pnVar4->popup).buf.active = 1;
    nVar5 = (ctx->memory).allocated;
    r.w = 16384.0;
    r.h = 16384.0;
    r.x = -8192.0;
    r.y = -8192.0;
    nk_push_scissor(&(__s->data).win.buffer,r);
    nVar19 = nk_panel_begin(ctx,title,NK_PANEL_POPUP);
    pnVar20 = pnVar4->layout;
    if (nVar19 == 0) {
      for (; pnVar20 != (nk_panel *)0x0; pnVar20 = pnVar20->parent) {
        pbVar1 = (byte *)((long)&pnVar20->flags + 2);
        *pbVar1 = *pbVar1 | 1;
      }
      nVar19 = 0;
      (pnVar4->popup).buf.active = 0;
      (pnVar4->popup).active = 0;
      (ctx->memory).allocated = nVar5;
      ctx->current = pnVar4;
      nk_free_page_element(ctx,(nk_page_element *)(__s->data).win.layout);
      (__s->data).win.layout = (nk_panel *)0x0;
    }
    else {
      for (; pnVar20 != (nk_panel *)0x0; pnVar20 = pnVar20->parent) {
        pnVar20->flags = pnVar20->flags & 0xfffeefff | 0x1000;
      }
      (pnVar4->popup).active = 1;
      pnVar20 = (__s->data).win.layout;
      pnVar20->offset_x = (nk_uint *)((long)&__s->data + 0x5c);
      pnVar20->offset_y = (nk_uint *)((long)&__s->data + 0x60);
      pnVar20->parent = pnVar4->layout;
      nVar19 = 1;
    }
  }
  return nVar19;
}

Assistant:

NK_API nk_bool
nk_popup_begin(struct nk_context *ctx, enum nk_popup_type type,
const char *title, nk_flags flags, struct nk_rect rect)
{
struct nk_window *popup;
struct nk_window *win;
struct nk_panel *panel;

int title_len;
nk_hash title_hash;
nk_size allocated;

NK_ASSERT(ctx);
NK_ASSERT(title);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return 0;

win = ctx->current;
panel = win->layout;
NK_ASSERT(!(panel->type & NK_PANEL_SET_POPUP) && "popups are not allowed to have popups");
(void)panel;
title_len = (int)nk_strlen(title);
title_hash = nk_murmur_hash(title, (int)title_len, NK_PANEL_POPUP);

popup = win->popup.win;
if (!popup) {
popup = (struct nk_window*)nk_create_window(ctx);
popup->parent = win;
win->popup.win = popup;
win->popup.active = 0;
win->popup.type = NK_PANEL_POPUP;
}

/* make sure we have correct popup */
if (win->popup.name != title_hash) {
if (!win->popup.active) {
nk_zero(popup, sizeof(*popup));
win->popup.name = title_hash;
win->popup.active = 1;
win->popup.type = NK_PANEL_POPUP;
} else return 0;
}

/* popup position is local to window */
ctx->current = popup;
rect.x += win->layout->clip.x;
rect.y += win->layout->clip.y;

/* setup popup data */
popup->parent = win;
popup->bounds = rect;
popup->seq = ctx->seq;
popup->layout = (struct nk_panel*)nk_create_panel(ctx);
popup->flags = flags;
popup->flags |= NK_WINDOW_BORDER;
if (type == NK_POPUP_DYNAMIC)
popup->flags |= NK_WINDOW_DYNAMIC;

popup->buffer = win->buffer;
nk_start_popup(ctx, win);
allocated = ctx->memory.allocated;
nk_push_scissor(&popup->buffer, nk_null_rect);

if (nk_panel_begin(ctx, title, NK_PANEL_POPUP)) {
/* popup is running therefore invalidate parent panels */
struct nk_panel *root;
root = win->layout;
while (root) {
root->flags |= NK_WINDOW_ROM;
root->flags &= ~(nk_flags)NK_WINDOW_REMOVE_ROM;
root = root->parent;
}
win->popup.active = 1;
popup->layout->offset_x = &popup->scrollbar.x;
popup->layout->offset_y = &popup->scrollbar.y;
popup->layout->parent = win->layout;
return 1;
} else {
/* popup was closed/is invalid so cleanup */
struct nk_panel *root;
root = win->layout;
while (root) {
root->flags |= NK_WINDOW_REMOVE_ROM;
root = root->parent;
}
win->popup.buf.active = 0;
win->popup.active = 0;
ctx->memory.allocated = allocated;
ctx->current = win;
nk_free_panel(ctx, popup->layout);
popup->layout = 0;
return 0;
}
}